

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg_schema.c
# Opt level: O0

void cfg_schema_add_section(cfg_schema *schema,cfg_schema_section *section)

{
  list_entity *plVar1;
  cfg_schema_entry *pcVar2;
  _Bool _Var3;
  char *pcVar4;
  list_entity *plVar5;
  ulong local_58;
  size_t i;
  cfg_schema_entry *entry;
  cfg_schema_section *section_local;
  cfg_schema *schema_local;
  
  _Var3 = cfg_is_allowed_key(section->type);
  if (!_Var3) {
    __assert_fail("cfg_is_allowed_key(section->type)",
                  "/workspace/llm4binary/github/license_c_cmakelists/OLSR[P]OONF/src/libconfig/cfg_schema.c"
                  ,0x70,
                  "void cfg_schema_add_section(struct cfg_schema *, struct cfg_schema_section *)");
  }
  if (section->def_name != (char *)0x0) {
    pcVar4 = strchr(section->def_name,0x20);
    if (pcVar4 != (char *)0x0) {
      __assert_fail("section->def_name == NULL || cfg_is_allowed_section_name(section->def_name)",
                    "/workspace/llm4binary/github/license_c_cmakelists/OLSR[P]OONF/src/libconfig/cfg_schema.c"
                    ,0x71,
                    "void cfg_schema_add_section(struct cfg_schema *, struct cfg_schema_section *)")
      ;
    }
  }
  (section->_section_node).key = section->type;
  avl_insert(&schema->sections,&section->_section_node);
  if (section->cb_delta_handler != (_func_void *)0x0) {
    plVar5 = &section->_delta_node;
    plVar1 = (schema->handlers).prev;
    plVar5->next = &schema->handlers;
    (section->_delta_node).prev = plVar1;
    (schema->handlers).prev = plVar5;
    plVar1->next = plVar5;
  }
  local_58 = 0;
  while( true ) {
    if (section->entry_count <= local_58) {
      return;
    }
    pcVar2 = section->entries;
    _Var3 = cfg_is_allowed_key(pcVar2[local_58].key.entry);
    if (!_Var3) break;
    pcVar2[local_58]._parent = section;
    pcVar2[local_58].key.type = section->type;
    pcVar2[local_58]._node.key = &pcVar2[local_58].key;
    if (((pcVar2[local_58].list & 1U) != 0) && (pcVar2[local_58].def.length == 1)) {
      pcVar2[local_58].def.length = 0;
    }
    avl_insert(&schema->entries,&section->entries[local_58]._node);
    local_58 = local_58 + 1;
  }
  __assert_fail("cfg_is_allowed_key(entry->key.entry)",
                "/workspace/llm4binary/github/license_c_cmakelists/OLSR[P]OONF/src/libconfig/cfg_schema.c"
                ,0x80,
                "void cfg_schema_add_section(struct cfg_schema *, struct cfg_schema_section *)");
}

Assistant:

void
cfg_schema_add_section(struct cfg_schema *schema, struct cfg_schema_section *section) {
  struct cfg_schema_entry *entry;
  size_t i;

  /* make sure definitions in compiled code are correct */
  assert(cfg_is_allowed_key(section->type));
  assert(section->def_name == NULL || cfg_is_allowed_section_name(section->def_name));

  /* hook section into global section tree */
  section->_section_node.key = section->type;
  avl_insert(&schema->sections, &section->_section_node);

  if (section->cb_delta_handler) {
    /* hook callback into global callback handler list */
    list_add_tail(&schema->handlers, &section->_delta_node);
  }

  for (i = 0; i < section->entry_count; i++) {
    entry = &section->entries[i];

    /* make sure key name in compiled code is correct */
    assert(cfg_is_allowed_key(entry->key.entry));

    entry->_parent = section;
    entry->key.type = section->type;
    entry->_node.key = &entry->key;

    if (entry->list && entry->def.length == 1) {
      /* empty list, set length to zero */
      entry->def.length = 0;
    }

#if 0
    /* make sure all defaults are the same */
    avl_for_each_elements_with_key(&schema->entries, entry_it, _node, entry,
        &section->entries[i].key) {
      if (section->entries[i].def.value == NULL) {
        /* if we have no default, copy the one from the first existing entry */
        memcpy(&section->entries[i].def, &entry->def, sizeof(entry->def));
        break;
      }
      else {
        /* if we have one, overwrite all existing entries */
        memcpy(&entry->def, &section->entries[i].def, sizeof(entry->def));

        // TODO: maybe output some logging that we overwrite the default?
      }
    }
#endif
    avl_insert(&schema->entries, &section->entries[i]._node);
  }
}